

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# islamcal.cpp
# Opt level: O0

int32_t __thiscall
icu_63::IslamicCalendar::handleGetYearLength(IslamicCalendar *this,int32_t extendedYear)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  uint local_28;
  int local_24;
  int i;
  int len;
  int32_t month;
  int32_t extendedYear_local;
  IslamicCalendar *this_local;
  
  if (((*(int *)&(this->super_Calendar).field_0x264 == 1) ||
      (*(int *)&(this->super_Calendar).field_0x264 == 3)) ||
     ((*(int *)&(this->super_Calendar).field_0x264 == 2 &&
      ((extendedYear < 0x514 || (0x640 < extendedYear)))))) {
    UVar1 = civilLeapYear(extendedYear);
    this_local._4_4_ = (UVar1 != '\0') + 0x162;
  }
  else if (*(int *)&(this->super_Calendar).field_0x264 == 0) {
    iVar2 = (extendedYear + -1) * 0xc;
    iVar3 = trueMonthStart(this,iVar2 + 0xc);
    iVar4 = trueMonthStart(this,iVar2);
    this_local._4_4_ = iVar3 - iVar4;
  }
  else {
    local_24 = 0;
    for (local_28 = 0; (int)local_28 < 0xc; local_28 = local_28 + 1) {
      iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x22])
                        (this,(ulong)(uint)extendedYear,(ulong)local_28);
      local_24 = iVar2 + local_24;
    }
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

int32_t IslamicCalendar::handleGetYearLength(int32_t extendedYear) const {
    if (cType == CIVIL || cType == TBLA ||
        (cType == UMALQURA && (extendedYear<UMALQURA_YEAR_START || extendedYear>UMALQURA_YEAR_END)) ) {
        return 354 + (civilLeapYear(extendedYear) ? 1 : 0);
    } else if(cType == ASTRONOMICAL){
        int32_t month = 12*(extendedYear-1);
        return (trueMonthStart(month + 12) - trueMonthStart(month));
    } else {
        int len = 0;
        for(int i=0; i<12; i++) {
            len += handleGetMonthLength(extendedYear, i);
        }
        return len;
    }
}